

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  int local_50;
  bool result;
  int X;
  int local_3c;
  undefined1 local_38 [4];
  int S;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  solution;
  int local_18;
  int iStack_14;
  bool solution_found;
  int L;
  int G;
  int R;
  
  G = 0;
  std::istream::operator>>((istream *)&std::cin,&L);
  std::istream::ignore();
  std::istream::operator>>((istream *)&std::cin,&stack0xffffffffffffffec);
  std::istream::ignore();
  std::istream::operator>>((istream *)&std::cin,&local_18);
  std::istream::ignore();
  solution.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size._7_1_ = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_38);
  do {
    std::istream::operator>>((istream *)&std::cin,&local_3c);
    std::istream::ignore();
    std::istream::operator>>((istream *)&std::cin,&local_50);
    std::istream::ignore();
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,L);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iStack_14);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_3c);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_50);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if ((solution.
         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl._M_node._M_size._7_1_ & 1) == 0) {
      bVar1 = find_solution(0,L,iStack_14,local_18,local_3c,local_50,false,
                            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"No solution found");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      bVar1 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_38);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Solution is empty");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    pvVar3 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)pvVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
  } while( true );
}

Assistant:

int main()
{
    int R; // the length of the road before the gap.
    cin >> R; cin.ignore();
    int G; // the length of the gap.
    cin >> G; cin.ignore();
    int L; // the length of the landing platform.
    cin >> L; cin.ignore();

    bool solution_found = false;
    std::list<std::string> solution;
    // game loop
    while (1)
    {
        int S; // the motorbike's speed.
        cin >> S; cin.ignore();
        int X; // the position on the road of the motorbike.
        cin >> X; cin.ignore();

        std::cerr << R << " " << G << " " << L << std::endl;
        std::cerr << S << " " << X << std::endl;
        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;

        if (!solution_found)
        {
            bool result = find_solution(0, R, G, L, S, X, false, solution);
            if (!result)
            {
                std::cerr << "No solution found" << std::endl;
            }
        } else if (solution.empty())
        {
            std::cout << "Solution is empty" << std::endl;
        }

        std::cout << solution.front() << std::endl;
        solution.pop_front();
    }
}